

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

bool __thiscall kratos::XXHash64::add(XXHash64 *this,void *input,uint64_t length)

{
  uchar uVar1;
  uint i;
  uint64_t uVar2;
  ulong uVar3;
  uchar *data;
  bool bVar4;
  uint uVar5;
  uint64_t local_58;
  uint64_t s0;
  uint64_t s1;
  uint64_t s2;
  uint64_t s3;
  
  bVar4 = length != 0 && input != (void *)0x0;
  s3._7_1_ = bVar4;
  if (length != 0 && input != (void *)0x0) {
    this->totalLength = this->totalLength + length;
    uVar3 = (ulong)this->bufferSize;
    if (uVar3 + length < 0x20) {
      for (uVar2 = 0; length != uVar2; uVar2 = uVar2 + 1) {
        uVar1 = *(uchar *)((long)input + uVar2);
        uVar5 = this->bufferSize;
        this->bufferSize = uVar5 + 1;
        this->buffer[uVar5] = uVar1;
      }
    }
    else {
      data = (uchar *)input;
      if (this->bufferSize != 0) {
        while ((uint)uVar3 < 0x20) {
          uVar1 = *data;
          data = data + 1;
          this->bufferSize = (uint)uVar3 + 1;
          this->buffer[uVar3] = uVar1;
          uVar3 = (ulong)this->bufferSize;
        }
        process(this->buffer,this->state,this->state + 1,this->state + 2,this->state + 3);
      }
      local_58 = this->state[0];
      s0 = this->state[1];
      s1 = this->state[2];
      s2 = this->state[3];
      uVar5 = ((int)length + (int)input) - (int)data;
      for (; data <= (uchar *)((long)input + (length - 0x20)); data = data + 0x20) {
        process(data,&local_58,&s0,&s1,&s2);
        uVar5 = uVar5 - 0x20;
      }
      this->state[0] = local_58;
      this->state[1] = s0;
      this->state[2] = s1;
      this->state[3] = s2;
      this->bufferSize = uVar5;
      for (uVar3 = 0; uVar3 < uVar5; uVar3 = uVar3 + 1) {
        this->buffer[uVar3] = data[uVar3];
        uVar5 = this->bufferSize;
      }
    }
  }
  return (bool)s3._7_1_;
}

Assistant:

bool add(const void* input, uint64_t length) {
        // no data ?
        if (!input || length == 0) return false;

        totalLength += length;
        // byte-wise access
        auto const* data = (const unsigned char*)input;

        // unprocessed old data plus new data still fit in temporary buffer ?
        if (bufferSize + length < MaxBufferSize) {
            // just add new data
            while (length-- > 0) buffer[bufferSize++] = *data++;
            return true;
        }

        // point beyond last byte
        const unsigned char* stop = data + length;
        const unsigned char* stopBlock = stop - MaxBufferSize;

        // some data left from previous update ?
        if (bufferSize > 0) {
            // make sure temporary buffer is full (16 bytes)
            while (bufferSize < MaxBufferSize) buffer[bufferSize++] = *data++;

            // process these 32 bytes (4x8)
            process(buffer, state[0], state[1], state[2], state[3]);
        }

        // copying state to local variables helps optimizer A LOT
        uint64_t s0 = state[0], s1 = state[1], s2 = state[2], s3 = state[3];
        // 32 bytes at once
        while (data <= stopBlock) {
            // local variables s0..s3 instead of state[0]..state[3] are much faster
            process(data, s0, s1, s2, s3);
            data += 32;
        }
        // copy back
        state[0] = s0;
        state[1] = s1;
        state[2] = s2;
        state[3] = s3;

        // copy remainder to temporary buffer
        bufferSize = stop - data;
        for (unsigned int i = 0; i < bufferSize; i++) buffer[i] = data[i];

        // done
        return true;
    }